

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O3

void get_valuables(obj *list)

{
  short sVar1;
  short *psVar2;
  long lVar3;
  obj *obj;
  
  if (list != (obj *)0x0) {
    do {
      if (list->cobj == (obj *)0x0) {
        if (list->oartifact == '\0') {
          if (list->oclass == '\r') {
            sVar1 = list->otyp;
            if ((long)sVar1 < 0x20f) {
              lVar3 = (long)sVar1 + -0x1f0;
              if (0x205 < sVar1) {
                lVar3 = 0x16;
              }
              if (gems[lVar3].count == 0) {
                gems[lVar3].count = (long)list->quan;
                gems[lVar3].typ = (int)sVar1;
              }
              else {
                gems[lVar3].count = gems[lVar3].count + (long)list->quan;
              }
            }
          }
          else if (list->oclass == '\x05') {
            sVar1 = list->otyp;
            psVar2 = &dbuf[0x14][0x39].obj + (long)sVar1 * 8;
            if (*(long *)psVar2 == 0) {
              *(long *)psVar2 = (long)list->quan;
              *(int *)(&dbuf[0x14][0x39].monflags + (long)sVar1 * 8) = (int)sVar1;
            }
            else {
              *(long *)psVar2 = *(long *)psVar2 + (long)list->quan;
            }
          }
        }
      }
      else {
        get_valuables(list->cobj);
      }
      list = list->nobj;
    } while (list != (obj *)0x0);
  }
  return;
}

Assistant:

static void get_valuables(struct obj *list)
{
    struct obj *obj;
    int i;

    /* find amulets and gems, ignoring all artifacts */
    for (obj = list; obj; obj = obj->nobj)
	if (Has_contents(obj)) {
	    get_valuables(obj->cobj);
	} else if (obj->oartifact) {
	    continue;
	} else if (obj->oclass == AMULET_CLASS) {
	    i = obj->otyp - FIRST_AMULET;
	    if (!amulets[i].count) {
		amulets[i].count = obj->quan;
		amulets[i].typ = obj->otyp;
	    } else amulets[i].count += obj->quan; /* always adds one */
	} else if (obj->oclass == GEM_CLASS && obj->otyp < LUCKSTONE) {
	    i = min(obj->otyp, LAST_GEM + 1) - FIRST_GEM;
	    if (!gems[i].count) {
		gems[i].count = obj->quan;
		gems[i].typ = obj->otyp;
	    } else gems[i].count += obj->quan;
	}
    return;
}